

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O2

void __thiscall
ConfigParser::ParseConfig
          (ConfigParser *this,HANDLE hmod,CmdLineArgsParser *parser,char16 *strCustomConfigFile)

{
  uint uVar1;
  ConfigFlagsTable *pCVar2;
  code *pcVar3;
  bool bVar4;
  errno_t eVar5;
  DWORD DVar6;
  int c;
  int iVar7;
  int iVar8;
  undefined4 *puVar9;
  char16_t *_Ext;
  char16 *_Filename;
  WCHAR local_c88 [4];
  char16 modulename [260];
  WCHAR local_a78 [4];
  char16 filename [260];
  WCHAR local_868 [4];
  WCHAR configFileFullName [260];
  WCHAR local_658 [4];
  char16 dir [256];
  char16 configBuffer [512];
  WCHAR local_4e [3];
  ConfigParser *pCStack_48;
  char16 drive [3];
  PAL_FILE *local_38;
  PAL_FILE *configFile;
  
  if ((strCustomConfigFile == (char16 *)0x0) && (this->_hasReadConfig != false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,0x17a,"(!_hasReadConfig || strCustomConfigFile != nullptr)",
                       "!_hasReadConfig || strCustomConfigFile != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  this->_hasReadConfig = true;
  _Filename = strCustomConfigFile;
  if (strCustomConfigFile == (char16 *)0x0) {
    _Filename = this->_configFileName;
  }
  _Ext = L"";
  if (strCustomConfigFile == (char16 *)0x0) {
    _Ext = L".config";
  }
  pCStack_48 = this;
  GetModuleFileNameW(hmod,local_c88,0x104);
  _wsplitpath_s(local_c88,local_4e,3,local_658,0x100,(WCHAR *)0x0,0,(WCHAR *)0x0,0);
  _wmakepath_s<260ul>((WCHAR (*) [260])local_a78,local_4e,local_658,_Filename,_Ext);
  eVar5 = _wfopen_unsafe(&local_38,local_a78,L"r");
  if ((eVar5 != 0) || (local_38 == (PAL_FILE *)0x0)) {
    DVar6 = GetEnvironmentVariableW(L"HOME",dir + 0xfc,0x104);
    if (DVar6 == 0) {
      return;
    }
    StringCchPrintfW(local_868,0x104,L"%s/%s%s",dir + 0xfc,_Filename,_Ext);
    eVar5 = _wfopen_unsafe(&local_38,local_868,L"r");
    if (eVar5 != 0) {
      return;
    }
    if (local_38 == (PAL_FILE *)0x0) {
      return;
    }
  }
  iVar8 = 0;
  while (iVar8 < 0x200) {
    c = PAL_getc(local_38);
    pCVar2 = pCStack_48->_flags;
    uVar1 = pCVar2->rawInputFromConfigFileIndex;
    if ((ulong)uVar1 < 0x200) {
      pCVar2->rawInputFromConfigFileIndex = uVar1 + 1;
      pCVar2->rawInputFromConfigFile[uVar1] = (char16)c;
    }
    if ((c == -1) || (iVar7 = isspace(c), c == 0 || iVar7 != 0)) {
      dir[(long)iVar8 + 0xfc] = L'\0';
      if ((0 < iVar8) && (iVar8 = CmdLineArgsParser::Parse(parser,dir + 0xfc), iVar8 != 0)) break;
      while( true ) {
        if (c == -1) goto LAB_00355d75;
        iVar8 = isspace(c);
        if ((c != 0) && (iVar8 == 0)) break;
        c = PAL_getc(local_38);
      }
      PAL_ungetc(c,local_38);
      iVar8 = 0;
    }
    else {
      dir[(long)iVar8 + 0xfc] = (char16)c;
      iVar8 = iVar8 + 1;
    }
  }
LAB_00355d75:
  PAL_fclose(local_38);
  return;
}

Assistant:

void ConfigParser::ParseConfig(HANDLE hmod, CmdLineArgsParser &parser, const char16* strCustomConfigFile)
{
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && CONFIG_PARSE_CONFIG_FILE
    Assert(!_hasReadConfig || strCustomConfigFile != nullptr);
    _hasReadConfig = true;

    const char16* configFileName = strCustomConfigFile;
    const char16* configFileExt = _u(""); /* in the custom config case,
                                             ext is expected to be passed
                                             in as part of the filename */

    if (configFileName == nullptr)
    {
        configFileName = _configFileName;
        configFileExt = _u(".config");
    }

    int err = 0;
    char16 modulename[_MAX_PATH];
    char16 filename[_MAX_PATH];

    GetModuleFileName((HMODULE)hmod, modulename, _MAX_PATH);
    char16 drive[_MAX_DRIVE];
    char16 dir[_MAX_DIR];

    _wsplitpath_s(modulename, drive, _MAX_DRIVE, dir, _MAX_DIR, nullptr, 0, nullptr, 0);
    _wmakepath_s(filename, drive, dir, configFileName, configFileExt);

    FILE* configFile;
#ifdef _WIN32
    if (_wfopen_s(&configFile, filename, _u("r, ccs=UNICODE")) != 0 || configFile == nullptr)
    {
        WCHAR configFileFullName[MAX_PATH];

        StringCchPrintf(configFileFullName, MAX_PATH, _u("%s%s"), configFileName, configFileExt);

        // try the one in the current working directory (Desktop)
        if (_wfullpath(filename, configFileFullName, _MAX_PATH) == nullptr)
        {
            return;
        }

        if (_wfopen_s(&configFile, filename, _u("r, ccs=UNICODE")) != 0 || configFile == nullptr)
        {
            return;
        }
    }
#else
    // Two-pathed for a couple reasons
    // 1. PAL doesn't like the ccs option passed in.
    // 2. _wfullpath is not implemented in the PAL.
    // Instead, on xplat, we'll check the HOME directory to see if there is
    // a config file there that we can use
    if (_wfopen_s(&configFile, filename, _u("r")) != 0 || configFile == nullptr)
    {
        WCHAR homeDir[MAX_PATH];

        if (GetEnvironmentVariable(_u("HOME"), homeDir, MAX_PATH) == 0)
        {
            return;
        }
        
        WCHAR configFileFullName[MAX_PATH];

        StringCchPrintf(configFileFullName, MAX_PATH, _u("%s/%s%s"), homeDir, configFileName, configFileExt);
        if (_wfopen_s(&configFile, configFileFullName, _u("r")) != 0 || configFile == nullptr)
        {
            return;
        }
    }
#endif

    char16 configBuffer[MaxTokenSize];
    int index = 0;

#ifdef _WIN32
#define ReadChar(file) fgetwc(file)
#define UnreadChar(c, file) ungetwc(c, file)
#define CharType wint_t
#define EndChar WEOF
#else
#define ReadChar(file) fgetc(file)
#define UnreadChar(c, file) ungetc(c, file)
#define CharType int
#define EndChar EOF
#endif

    // We don't expect the token to overflow- if it does
    // the simplest thing to do would be to ignore the
    // read tokens
    // We could use _fwscanf_s here but the function
    // isn't implemented in the PAL and we'd have to deal with
    // wchar => char16 impedance mismatch.
    while (index < MaxTokenSize)
    {
        CharType curChar = ReadChar(configFile);

        if (this->_flags.rawInputFromConfigFileIndex < sizeof(this->_flags.rawInputFromConfigFile) / sizeof(this->_flags.rawInputFromConfigFile[0]))
        {
            this->_flags.rawInputFromConfigFile[this->_flags.rawInputFromConfigFileIndex++] = curChar;
        }

        if (curChar == EndChar || isspace(curChar) || curChar == 0)
        {
            configBuffer[index] = 0;

            // Parse only if there's something in configBuffer
            if (index > 0 && (err = parser.Parse(configBuffer)) != 0)
            {
                break;
            }

            while(curChar != EndChar && (isspace(curChar) || curChar == 0))
            {
                curChar = ReadChar(configFile);
            }

            if (curChar == EndChar)
            {
                break;
            }
            else
            {
                UnreadChar(curChar, configFile);
            }

            index = 0;
        }
        else
        {
            // The expectation is that non-ANSI characters
            // are not used in the config- otherwise it will
            // be interpreted incorrectly here
            configBuffer[index++] = (char16) curChar;
        }
    }

#undef ReadChar
#undef UnreadChar
#undef CharType
#undef EndChar

    fclose(configFile);

    if (err !=0)
    {
        return;
    }
#endif
}